

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.h
# Opt level: O3

void __thiscall QSharedMemory::setNativeKey(QSharedMemory *this,QString *key,Type type)

{
  long in_FS_OFFSET;
  QNativeIpcKey local_38;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (QNativeIpcKeyPrivate *)0x0;
  local_38.key.d.d = (key->d).d;
  local_38.key.d.ptr = (key->d).ptr;
  local_38.key.d.size = (key->d).size;
  if (local_38.key.d.d != (Data *)0x0) {
    LOCK();
    ((local_38.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38.typeAndFlags.reserved1 = 0;
  local_38.typeAndFlags.reserved2 = 0;
  local_38.typeAndFlags.type = type;
  setNativeKey(this,&local_38);
  QNativeIpcKey::~QNativeIpcKey(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setNativeKey(const QString &key, QNativeIpcKey::Type type = QNativeIpcKey::legacyDefaultTypeForOs())
    { setNativeKey({ key, type }); }